

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O0

Vector * __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  double *pdVar6;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  ExtendedKalmanFilter *this_00;
  Vector *this_01;
  double dVar7;
  Type local_458;
  uint local_424;
  Type local_420;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_3f0;
  Type local_3a8;
  Type local_378;
  Type local_348;
  Vector3 local_318;
  Matrix3 local_300;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2b8;
  Vector3 local_2a8;
  Matrix3 local_290;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>
  local_248;
  uint local_20c;
  undefined1 local_208 [4];
  int i_3;
  timespec local_1d8;
  timespec local_1c8;
  Scalar local_1b8;
  Scalar local_1b0;
  int local_1a4;
  undefined1 local_1a0 [4];
  int i_2;
  EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> local_168 [56];
  Matrix<double,3,1,0,3,1> local_130 [24];
  Matrix<double,__1,_1,_0,__1,_1> local_118;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  Matrix<double,__1,_1,_0,__1,_1> local_e8;
  Type local_d8;
  value_type local_a8;
  uint local_8c;
  undefined1 local_88 [4];
  uint i_1;
  Matrix local_60;
  uint local_44;
  undefined1 local_40 [4];
  uint i;
  timespec time3;
  timespec time2;
  timespec time1;
  ModelBaseEKFFlexEstimatorIMU *this_local;
  
  if ((this->on_ & 1U) == 1) {
    clock_gettime(2,(timespec *)&time2.tv_nsec);
    clock_gettime(2,(timespec *)&time3.tv_nsec);
    uVar2 = ZeroDelayObserver::getMeasurementsNumber
                      ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
    if (uVar2 != 0) {
      clock_gettime(2,(timespec *)&time2.tv_nsec);
      clock_gettime(2,(timespec *)&time3.tv_nsec);
      uVar2 = ZeroDelayObserver::getMeasurementTime
                        ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
      (this->super_EKFFlexibilityEstimatorBase).k_ = uVar2;
      local_44 = ZeroDelayObserver::getCurrentTime
                           ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
      while( true ) {
        local_44 = local_44 + 1;
        if ((this->super_EKFFlexibilityEstimatorBase).k_ < local_44) break;
        if (((this->super_EKFFlexibilityEstimatorBase).finiteDifferencesJacobians_ & 1U) != 0) {
          this_00 = &(this->super_EKFFlexibilityEstimatorBase).ekf_;
          KalmanFilterBase::updatePredictedMeasurement(&this_00->super_KalmanFilterBase);
          IMUElasticLocalFrameDynamicalSystem::stateDynamicsJacobian(&local_60,&this->functor_);
          KalmanFilterBase::setA(&this_00->super_KalmanFilterBase,&local_60);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_60);
          IMUElasticLocalFrameDynamicalSystem::measureDynamicsJacobian
                    ((Matrix *)local_88,&this->functor_);
          KalmanFilterBase::setC
                    (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,
                     (Matrix *)local_88);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_88);
        }
        std::
        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ::clear(&this->contactPositions_);
        for (local_8c = 0; uVar2 = local_8c,
            uVar3 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_),
            uVar2 < uVar3; local_8c = local_8c + 1) {
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0xe])();
          Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
                    (&local_d8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                     (ulong)(local_8c * 0xc + 0x2a),3);
          Eigen::Matrix<double,3,1,0,3,1>::
          Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
                    ((Matrix<double,3,1,0,3,1> *)&local_a8,
                     (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_d8);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::push_back(&this->contactPositions_,&local_a8);
          Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_e8);
        }
        ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_f8,(int)this + 8);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_f8)
        ;
      }
      ZeroDelayObserver::getEstimatedState((ZeroDelayObserver *)local_108,(int)this + 8);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                (&this->x_,(Matrix<double,__1,_1,_0,__1,_1> *)local_108);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_108);
      bVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::hasNaN
                        ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_);
      if (bVar1) {
        ZeroDelayObserver::setState
                  ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,
                   &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                   (this->super_EKFFlexibilityEstimatorBase).k_);
        if (1 < (this->super_EKFFlexibilityEstimatorBase).k_) {
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x17])();
          (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x3e])();
        }
      }
      else {
        this_01 = &(this->super_EKFFlexibilityEstimatorBase).lastX_;
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(this_01,&this->x_);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                  ((Type *)local_168,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,3
                   ,3);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>(local_130,local_168);
        kine::regulateOrientationVector((kine *)&local_118,(Vector3 *)local_130);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                  ((Type *)local_1a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_01,3
                   ,3);
        Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)local_1a0,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_118);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_118);
        if ((this->limitOn_ & 1U) != 0) {
          for (local_1a4 = 0; local_1a4 < 3; local_1a4 = local_1a4 + 1) {
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0x12));
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitTorques_,(long)local_1a4);
            pdVar6 = std::min<double>(pSVar4,pSVar5);
            dVar7 = *pdVar6;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0x12));
            *pSVar4 = dVar7;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0xc));
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitForces_,(long)local_1a4);
            pdVar6 = std::min<double>(pSVar4,pSVar5);
            dVar7 = *pdVar6;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0xc));
            *pSVar4 = dVar7;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0x12));
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitTorques_,(long)local_1a4);
            local_1b0 = -*pSVar5;
            pdVar6 = std::max<double>(pSVar4,&local_1b0);
            dVar7 = *pdVar6;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0x12));
            *pSVar4 = dVar7;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0xc));
            pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                &this->limitForces_,(long)local_1a4);
            local_1b8 = -*pSVar5;
            pdVar6 = std::max<double>(pSVar4,&local_1b8);
            dVar7 = *pdVar6;
            pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                &(this->super_EKFFlexibilityEstimatorBase).lastX_,
                                (ulong)(local_1a4 + 0xc));
            *pSVar4 = dVar7;
          }
        }
        uVar2 = ZeroDelayObserver::getCurrentTime
                          ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
        ZeroDelayObserver::setState
                  ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,
                   &(this->super_EKFFlexibilityEstimatorBase).lastX_,uVar2);
      }
    }
    clock_gettime(2,(timespec *)local_40);
    local_1c8 = diff((timespec *)&time3.tv_nsec,(timespec *)local_40);
    dVar7 = (double)local_1c8.tv_nsec;
    local_1d8 = diff((timespec *)&time2.tv_nsec,(timespec *)&time3.tv_nsec);
    this->computeFlexibilityTime_ = dVar7 - (double)local_1d8.tv_nsec;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              ((Type *)local_208,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,6,3
              );
    Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3,_1,_false>_>::setZero
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
               local_208);
    for (local_20c = 0; uVar2 = local_20c,
        uVar3 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_),
        uVar2 < uVar3; local_20c = local_20c + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
                (&local_348,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,3,3);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>>
                ((Matrix<double,3,1,0,3,1> *)&local_318,
                 (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
                 &local_348);
      kine::rotationVectorToRotationMatrix(&local_300,&local_318);
      other = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              std::
              vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ::operator[](&this->contactPositions_,(long)(int)local_20c);
      local_2b8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                            ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_300,other);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
                ((Matrix<double,3,1,0,3,1> *)&local_2a8,
                 (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                  *)&local_2b8);
      kine::skewSymmetric(&local_290,&local_2a8);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
                (&local_378,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,9,3);
      Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                (&local_248,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_290,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
                 &local_378);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
                (&local_3a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,6,3);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
                ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_3a8
                 ,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_0>_>
                   *)&local_248);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_420,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,6,3);
    local_424 = IMUElasticLocalFrameDynamicalSystem::getContactsNumber(&this->functor_);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator/
              (&local_3f0,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_420,
               &local_424);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_458,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_,6,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_458,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_3f0);
  }
  else {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &(this->super_EKFFlexibilityEstimatorBase).lastX_);
    uVar2 = ZeroDelayObserver::getCurrentTime
                      ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
    ZeroDelayObserver::setState
              ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_,
               &(this->super_EKFFlexibilityEstimatorBase).lastX_,uVar2);
    uVar2 = ZeroDelayObserver::getMeasurementsNumber
                      ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
    if (uVar2 != 0) {
      ZeroDelayObserver::clearMeasurements
                ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
      ZeroDelayObserver::clearInputs
                ((ZeroDelayObserver *)&(this->super_EKFFlexibilityEstimatorBase).ekf_);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x3e])();
    }
  }
  IMUElasticLocalFrameDynamicalSystem::setPrinted(&this->functor_,false);
  return &(this->super_EKFFlexibilityEstimatorBase).lastX_;
}

Assistant:

const Vector & ModelBaseEKFFlexEstimatorIMU::getFlexibilityVector()
    {
      timespec time1, time2, time3;

      if(on_==true)
      {
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
        if (ekf_.getMeasurementsNumber()>0)
        {
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time1);
          clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time2);
          k_=ekf_.getMeasurementTime();

          unsigned i;
          for (i=ekf_.getCurrentTime()+1; i<=k_; ++i)
          {
            if (finiteDifferencesJacobians_)
            {
              ekf_.updatePredictedMeasurement();///triggers also ekf_.updatePrediction();

              //ekf_.setA(ekf_.getAMatrixFD(dx_));
              //ekf_.setC(ekf_.getCMatrixFD(dx_));
              ekf_.setA(functor_.stateDynamicsJacobian());
              ekf_.setC(functor_.measureDynamicsJacobian());
            }

            ///regulate the part of orientation vector in the state vector
            ///temporary code
            contactPositions_.clear();
            for (unsigned i = 0; i<functor_.getContactsNumber() ; ++i)
            {
              contactPositions_.push_back(getInput().segment<3>(42 + 12*i));
            }
            ekf_.getEstimatedState(i);
          }
          x_=ekf_.getEstimatedState(k_);
#ifndef EIGEN_VERSION_LESS_THAN_3_2
          if (! x_.hasNaN())//detect NaN values
          {
#else
          if (x_==x_)//detect NaN values
          {
#endif // EIGEN_VERSION_LESS_THAN_3_2
            lastX_=x_;

            ///regulate the part of orientation vector in the state vector
            lastX_.segment(state::ori,3)=kine::regulateOrientationVector(lastX_.segment(state::ori,3));
            if(limitOn_)
            {
              for(int i=0; i<3; i++)
              {
                // Saturation for bounded forces and torques
                lastX_[state::fc+6+i]=std::min(lastX_[state::fc+6+i],limitTorques_[i]);
                lastX_[state::fc+i]=std::min(lastX_[state::fc+i],limitForces_[i]);
                lastX_[state::fc+6+i]=std::max(lastX_[state::fc+6+i],-limitTorques_[i]);
                lastX_[state::fc+i]=std::max(lastX_[state::fc+i],-limitForces_[i]);
              }
            }
            ekf_.setState(lastX_,ekf_.getCurrentTime());
          }
          else //delete NaN values
          {
            ekf_.setState(lastX_,k_);

            if(k_>1) //the first iteration give always nan when not
              //initialized
            {
              resetCovarianceMatrices();
              resetStateCovarianceMatrix();
            }
          }
        }
        clock_gettime(CLOCK_PROCESS_CPUTIME_ID, &time3);

        computeFlexibilityTime_=(double)diff(time2,time3).tv_nsec-(double)diff(time1,time2).tv_nsec;

        // To be deleted: constrain the internal linear velocity of the flexibility of each foot to zero.
        x_.segment<3>(state::linVel).setZero();
        for(int i=0; i<functor_.getContactsNumber();++i)
        {
          x_.segment<3>(state::linVel) += kine::skewSymmetric(kine::rotationVectorToRotationMatrix(x_.segment<3>(state::ori))*contactPositions_[i])*x_.segment<3>(state::angVel);
        }
        x_.segment<3>(state::linVel)=x_.segment<3>(state::linVel)/functor_.getContactsNumber();
      }
      else
      {
        lastX_.setZero();
        ekf_.setState(lastX_,ekf_.getCurrentTime());

        if (ekf_.getMeasurementsNumber()>0)
        {
          ekf_.clearMeasurements();
          ekf_.clearInputs();
          resetStateCovarianceMatrix();
        }
      }

      functor_.setPrinted(false);
      return lastX_;
    }

    stateObservation::Matrix& ModelBaseEKFFlexEstimatorIMU::computeLocalObservationMatrix()
    {
        op_.O.resize(getMeasurementSize()*2,getStateSize());
        op_.CA.resize(getMeasurementSize(),getStateSize());
        op_.CA  = ekf_.getC();
        op_.O.block(0,0,getMeasurementSize(),getStateSize()) = op_.CA;
        op_.CA = op_.CA * ekf_.getA();
        op_.O.block(getMeasurementSize(),0,getMeasurementSize(),getStateSize()) = op_.CA;
        return op_.O;
    }

    void ModelBaseEKFFlexEstimatorIMU::setSamplingPeriod(double dt)
    {
        dt_=dt;
        functor_.setSamplingPeriod(dt);
    }

    /// Enable or disable the estimation
    void ModelBaseEKFFlexEstimatorIMU::setOn(bool & b)
    {
        on_=b;
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfe(const Matrix3 & m)
    {
        functor_.setKfe(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfv(const Matrix3 & m)
    {
        functor_.setKfv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKte(const Matrix3 & m)
    {
        functor_.setKte(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtv(const Matrix3 & m)
    {
        functor_.setKtv(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfeRopes(const Matrix3 & m)
    {
        functor_.setKfeRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKfvRopes(const Matrix3 & m)
    {
        functor_.setKfvRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKteRopes(const Matrix3 & m)
    {
        functor_.setKteRopes(m);
    }

    void ModelBaseEKFFlexEstimatorIMU::setKtvRopes(const Matrix3 & m)
    {
        functor_.setKtvRopes(m);
	}

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfe() const
    {
        return functor_.getKfe();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKfv() const
    {
        return functor_.getKfv();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKte() const
    {
        return functor_.getKte();
    }

    Matrix ModelBaseEKFFlexEstimatorIMU::getKtv() const
    {
        return functor_.getKtv();
    }

    double& ModelBaseEKFFlexEstimatorIMU::getComputeFlexibilityTime()
    {
        return computeFlexibilityTime_;
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithForcesMeasurements(bool b)
    {
      if (useFTSensors_!= b)
      {
        useFTSensors_=b;
        functor_.setWithForceMeasurements(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());

        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithAbsolutePos(bool b)
    {
      if (withAbsolutePos_!= b)
      {
        functor_.setWithAbsolutePosition(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        withAbsolutePos_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setWithUnmodeledForces(bool b)
    {
      if (withUnmodeledForces_!= b)
      {
        functor_.setWithUnmodeledForces(b);
        ekf_.setMeasureSize(functor_.getMeasurementSize());
        ekf_.setInputSize(functor_.getInputSize());
        withUnmodeledForces_=b;
        updateMeasurementCovarianceMatrix_();
      }
    }

    bool ModelBaseEKFFlexEstimatorIMU::getWithForcesMeasurements()
    {
        return useFTSensors_;
    }


    void ModelBaseEKFFlexEstimatorIMU::setWithComBias(bool b)
    {
      if (withComBias_!= b)
      {
        withComBias_=b;
        functor_.setWithComBias(b);
      }
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceVariance(double d)
    {
        unmodeledForceVariance_ = d;
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
        P_=ekf_.getStateCovariance();
        P_.diagonal().segment<6>(state::unmodeledForces).setConstant(unmodeledForceVariance_);
        ekf_.setStateCovariance(P_);
    }

    void ModelBaseEKFFlexEstimatorIMU::setUnmodeledForceProcessVariance(double d)
    {
        Q_.diagonal().segment<6>(state::unmodeledForces).setConstant(d);
        ekf_.setQ(Q_);
        if (d>0)
        {
          setWithUnmodeledForces(true);
        }
    }

    void ModelBaseEKFFlexEstimatorIMU::setForceVariance(double d)
    {
        forceVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setAbsolutePosVariance(double d)
    {
        absPosVariance_ = d;
        updateMeasurementCovarianceMatrix_();
    }

    void ModelBaseEKFFlexEstimatorIMU::setRobotMass(double m)
    {
        functor_.setRobotMass(m);
    }

}